

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitdeque.h
# Opt level: O2

void __thiscall bitdeque<32768>::erase_front(bitdeque<32768> *this,size_type n)

{
  bitset<32768UL> *this_00;
  const_iterator __last;
  ulong uVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  bool bVar3;
  const_iterator in_stack_ffffffffffffff08;
  _Elt_pointer pbVar4;
  _Elt_pointer pbVar5;
  _Elt_pointer pbVar6;
  _Map_pointer ppbVar7;
  _Self local_b8;
  _Self local_98;
  _Elt_pointer local_78;
  _Elt_pointer pbStack_70;
  _Elt_pointer local_68;
  _Map_pointer ppbStack_60;
  _Elt_pointer local_50;
  _Elt_pointer local_48;
  _Elt_pointer local_40;
  _Map_pointer local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = 0x8000 - (long)this->m_pad_begin;
  uVar2 = n - uVar1;
  if (uVar1 <= n) {
    this->m_pad_begin = 0;
    pbVar4 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_cur;
    pbVar5 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_first;
    pbVar6 = (this->m_deque).
             super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>._M_impl
             .super__Deque_impl_data._M_start._M_last;
    ppbVar7 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_node;
    local_50 = pbVar4;
    local_48 = pbVar5;
    local_40 = pbVar6;
    local_38 = ppbVar7;
    std::operator+(&local_b8,(_Self *)&stack0xffffffffffffff28,1);
    std::operator+(&local_98,&local_b8,uVar2 >> 0xf);
    local_78 = local_98._M_cur;
    pbStack_70 = local_98._M_first;
    local_68 = local_98._M_last;
    ppbStack_60 = local_98._M_node;
    __last._M_first = pbVar5;
    __last._M_cur = pbVar4;
    __last._M_last = pbVar6;
    __last._M_node = ppbVar7;
    std::deque<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>::erase
              ((iterator *)&stack0xffffffffffffff08,&this->m_deque,in_stack_ffffffffffffff08,__last)
    ;
    n = (size_type)((uint)uVar2 & 0x7fff);
  }
  if (n != 0) {
    this_00 = (this->m_deque).
              super__Deque_base<std::bitset<32768UL>,_std::allocator<std::bitset<32768UL>_>_>.
              _M_impl.super__Deque_impl_data._M_start._M_cur;
    while (bVar3 = n != 0, n = n - 1, bVar3) {
      std::bitset<32768UL>::reset(this_00,(long)this->m_pad_begin);
      this->m_pad_begin = this->m_pad_begin + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void erase_front(size_type n)
    {
        if (n >= static_cast<size_type>(BITS_PER_WORD - m_pad_begin)) {
            n -= BITS_PER_WORD - m_pad_begin;
            m_pad_begin = 0;
            m_deque.erase(m_deque.begin(), m_deque.begin() + 1 + (n / BITS_PER_WORD));
            n %= BITS_PER_WORD;
        }
        if (n) {
            auto& first = m_deque.front();
            while (n) {
                first.reset(m_pad_begin);
                ++m_pad_begin;
                --n;
            }
        }
    }